

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lebedev_laikov.hpp
# Opt level: O0

tuple<std::vector<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>,_std::vector<double,_std::allocator<double>_>_>
* IntegratorXX::quadrature_traits<IntegratorXX::LebedevLaikov<double>,_void>::generate
            (tuple<std::vector<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>,_std::vector<double,_std::allocator<double>_>_>
             *__return_storage_ptr__,size_t npts)

{
  pointer __n;
  reference pvVar1;
  int local_68;
  allocator<double> local_61;
  int i;
  weight_container weights;
  allocator<std::array<double,_3UL>_> local_31;
  undefined1 local_30 [8];
  point_container points;
  size_t npts_local;
  
  points.super__Vector_base<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)npts;
  std::allocator<std::array<double,_3UL>_>::allocator(&local_31);
  std::vector<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>::vector
            ((vector<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_> *)local_30,
             npts,&local_31);
  std::allocator<std::array<double,_3UL>_>::~allocator(&local_31);
  __n = points.
        super__Vector_base<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage;
  std::allocator<double>::allocator(&local_61);
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)&i,(size_type)__n,&local_61);
  std::allocator<double>::~allocator(&local_61);
  if (points.super__Vector_base<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage == (pointer)0x6) {
    detail::
    copy_grid<IntegratorXX::LebedevLaikovGrids::lebedev_laikov_6<double>,std::vector<std::array<double,3ul>,std::allocator<std::array<double,3ul>>>,std::vector<double,std::allocator<double>>>
              ((vector<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_> *)
               local_30,(vector<double,_std::allocator<double>_> *)&i);
  }
  else if (points.
           super__Vector_base<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>.
           _M_impl.super__Vector_impl_data._M_end_of_storage == (pointer)0xe) {
    detail::
    copy_grid<IntegratorXX::LebedevLaikovGrids::lebedev_laikov_14<double>,std::vector<std::array<double,3ul>,std::allocator<std::array<double,3ul>>>,std::vector<double,std::allocator<double>>>
              ((vector<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_> *)
               local_30,(vector<double,_std::allocator<double>_> *)&i);
  }
  else if (points.
           super__Vector_base<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>.
           _M_impl.super__Vector_impl_data._M_end_of_storage == (pointer)0x1a) {
    detail::
    copy_grid<IntegratorXX::LebedevLaikovGrids::lebedev_laikov_26<double>,std::vector<std::array<double,3ul>,std::allocator<std::array<double,3ul>>>,std::vector<double,std::allocator<double>>>
              ((vector<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_> *)
               local_30,(vector<double,_std::allocator<double>_> *)&i);
  }
  else if (points.
           super__Vector_base<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>.
           _M_impl.super__Vector_impl_data._M_end_of_storage == (pointer)0x26) {
    detail::
    copy_grid<IntegratorXX::LebedevLaikovGrids::lebedev_laikov_38<double>,std::vector<std::array<double,3ul>,std::allocator<std::array<double,3ul>>>,std::vector<double,std::allocator<double>>>
              ((vector<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_> *)
               local_30,(vector<double,_std::allocator<double>_> *)&i);
  }
  else if (points.
           super__Vector_base<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>.
           _M_impl.super__Vector_impl_data._M_end_of_storage == (pointer)0x32) {
    detail::
    copy_grid<IntegratorXX::LebedevLaikovGrids::lebedev_laikov_50<double>,std::vector<std::array<double,3ul>,std::allocator<std::array<double,3ul>>>,std::vector<double,std::allocator<double>>>
              ((vector<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_> *)
               local_30,(vector<double,_std::allocator<double>_> *)&i);
  }
  else if (points.
           super__Vector_base<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>.
           _M_impl.super__Vector_impl_data._M_end_of_storage == (pointer)0x4a) {
    detail::
    copy_grid<IntegratorXX::LebedevLaikovGrids::lebedev_laikov_74<double>,std::vector<std::array<double,3ul>,std::allocator<std::array<double,3ul>>>,std::vector<double,std::allocator<double>>>
              ((vector<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_> *)
               local_30,(vector<double,_std::allocator<double>_> *)&i);
  }
  else if (points.
           super__Vector_base<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>.
           _M_impl.super__Vector_impl_data._M_end_of_storage == (pointer)0x56) {
    detail::
    copy_grid<IntegratorXX::LebedevLaikovGrids::lebedev_laikov_86<double>,std::vector<std::array<double,3ul>,std::allocator<std::array<double,3ul>>>,std::vector<double,std::allocator<double>>>
              ((vector<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_> *)
               local_30,(vector<double,_std::allocator<double>_> *)&i);
  }
  else if (points.
           super__Vector_base<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>.
           _M_impl.super__Vector_impl_data._M_end_of_storage == (pointer)0x6e) {
    detail::
    copy_grid<IntegratorXX::LebedevLaikovGrids::lebedev_laikov_110<double>,std::vector<std::array<double,3ul>,std::allocator<std::array<double,3ul>>>,std::vector<double,std::allocator<double>>>
              ((vector<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_> *)
               local_30,(vector<double,_std::allocator<double>_> *)&i);
  }
  else if (points.
           super__Vector_base<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>.
           _M_impl.super__Vector_impl_data._M_end_of_storage == (pointer)0x92) {
    detail::
    copy_grid<IntegratorXX::LebedevLaikovGrids::lebedev_laikov_146<double>,std::vector<std::array<double,3ul>,std::allocator<std::array<double,3ul>>>,std::vector<double,std::allocator<double>>>
              ((vector<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_> *)
               local_30,(vector<double,_std::allocator<double>_> *)&i);
  }
  else if (points.
           super__Vector_base<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>.
           _M_impl.super__Vector_impl_data._M_end_of_storage == (pointer)0xaa) {
    detail::
    copy_grid<IntegratorXX::LebedevLaikovGrids::lebedev_laikov_170<double>,std::vector<std::array<double,3ul>,std::allocator<std::array<double,3ul>>>,std::vector<double,std::allocator<double>>>
              ((vector<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_> *)
               local_30,(vector<double,_std::allocator<double>_> *)&i);
  }
  else if (points.
           super__Vector_base<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>.
           _M_impl.super__Vector_impl_data._M_end_of_storage == (pointer)0xc2) {
    detail::
    copy_grid<IntegratorXX::LebedevLaikovGrids::lebedev_laikov_194<double>,std::vector<std::array<double,3ul>,std::allocator<std::array<double,3ul>>>,std::vector<double,std::allocator<double>>>
              ((vector<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_> *)
               local_30,(vector<double,_std::allocator<double>_> *)&i);
  }
  else if (points.
           super__Vector_base<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>.
           _M_impl.super__Vector_impl_data._M_end_of_storage == (pointer)0xe6) {
    detail::
    copy_grid<IntegratorXX::LebedevLaikovGrids::lebedev_laikov_230<double>,std::vector<std::array<double,3ul>,std::allocator<std::array<double,3ul>>>,std::vector<double,std::allocator<double>>>
              ((vector<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_> *)
               local_30,(vector<double,_std::allocator<double>_> *)&i);
  }
  else if (points.
           super__Vector_base<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>.
           _M_impl.super__Vector_impl_data._M_end_of_storage == (pointer)0x10a) {
    detail::
    copy_grid<IntegratorXX::LebedevLaikovGrids::lebedev_laikov_266<double>,std::vector<std::array<double,3ul>,std::allocator<std::array<double,3ul>>>,std::vector<double,std::allocator<double>>>
              ((vector<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_> *)
               local_30,(vector<double,_std::allocator<double>_> *)&i);
  }
  else if (points.
           super__Vector_base<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>.
           _M_impl.super__Vector_impl_data._M_end_of_storage == (pointer)0x12e) {
    detail::
    copy_grid<IntegratorXX::LebedevLaikovGrids::lebedev_laikov_302<double>,std::vector<std::array<double,3ul>,std::allocator<std::array<double,3ul>>>,std::vector<double,std::allocator<double>>>
              ((vector<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_> *)
               local_30,(vector<double,_std::allocator<double>_> *)&i);
  }
  else if (points.
           super__Vector_base<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>.
           _M_impl.super__Vector_impl_data._M_end_of_storage == (pointer)0x15e) {
    detail::
    copy_grid<IntegratorXX::LebedevLaikovGrids::lebedev_laikov_350<double>,std::vector<std::array<double,3ul>,std::allocator<std::array<double,3ul>>>,std::vector<double,std::allocator<double>>>
              ((vector<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_> *)
               local_30,(vector<double,_std::allocator<double>_> *)&i);
  }
  else if (points.
           super__Vector_base<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>.
           _M_impl.super__Vector_impl_data._M_end_of_storage == (pointer)0x1b2) {
    detail::
    copy_grid<IntegratorXX::LebedevLaikovGrids::lebedev_laikov_434<double>,std::vector<std::array<double,3ul>,std::allocator<std::array<double,3ul>>>,std::vector<double,std::allocator<double>>>
              ((vector<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_> *)
               local_30,(vector<double,_std::allocator<double>_> *)&i);
  }
  else if (points.
           super__Vector_base<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>.
           _M_impl.super__Vector_impl_data._M_end_of_storage == (pointer)0x24e) {
    detail::
    copy_grid<IntegratorXX::LebedevLaikovGrids::lebedev_laikov_590<double>,std::vector<std::array<double,3ul>,std::allocator<std::array<double,3ul>>>,std::vector<double,std::allocator<double>>>
              ((vector<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_> *)
               local_30,(vector<double,_std::allocator<double>_> *)&i);
  }
  else if (points.
           super__Vector_base<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>.
           _M_impl.super__Vector_impl_data._M_end_of_storage == (pointer)0x302) {
    detail::
    copy_grid<IntegratorXX::LebedevLaikovGrids::lebedev_laikov_770<double>,std::vector<std::array<double,3ul>,std::allocator<std::array<double,3ul>>>,std::vector<double,std::allocator<double>>>
              ((vector<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_> *)
               local_30,(vector<double,_std::allocator<double>_> *)&i);
  }
  else if (points.
           super__Vector_base<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>.
           _M_impl.super__Vector_impl_data._M_end_of_storage == (pointer)0x3ce) {
    detail::
    copy_grid<IntegratorXX::LebedevLaikovGrids::lebedev_laikov_974<double>,std::vector<std::array<double,3ul>,std::allocator<std::array<double,3ul>>>,std::vector<double,std::allocator<double>>>
              ((vector<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_> *)
               local_30,(vector<double,_std::allocator<double>_> *)&i);
  }
  else if (points.
           super__Vector_base<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>.
           _M_impl.super__Vector_impl_data._M_end_of_storage == (pointer)0x4b2) {
    detail::
    copy_grid<IntegratorXX::LebedevLaikovGrids::lebedev_laikov_1202<double>,std::vector<std::array<double,3ul>,std::allocator<std::array<double,3ul>>>,std::vector<double,std::allocator<double>>>
              ((vector<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_> *)
               local_30,(vector<double,_std::allocator<double>_> *)&i);
  }
  else if (points.
           super__Vector_base<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>.
           _M_impl.super__Vector_impl_data._M_end_of_storage == (pointer)0x5ae) {
    detail::
    copy_grid<IntegratorXX::LebedevLaikovGrids::lebedev_laikov_1454<double>,std::vector<std::array<double,3ul>,std::allocator<std::array<double,3ul>>>,std::vector<double,std::allocator<double>>>
              ((vector<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_> *)
               local_30,(vector<double,_std::allocator<double>_> *)&i);
  }
  else if (points.
           super__Vector_base<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>.
           _M_impl.super__Vector_impl_data._M_end_of_storage == (pointer)0x6c2) {
    detail::
    copy_grid<IntegratorXX::LebedevLaikovGrids::lebedev_laikov_1730<double>,std::vector<std::array<double,3ul>,std::allocator<std::array<double,3ul>>>,std::vector<double,std::allocator<double>>>
              ((vector<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_> *)
               local_30,(vector<double,_std::allocator<double>_> *)&i);
  }
  else if (points.
           super__Vector_base<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>.
           _M_impl.super__Vector_impl_data._M_end_of_storage == (pointer)0x7ee) {
    detail::
    copy_grid<IntegratorXX::LebedevLaikovGrids::lebedev_laikov_2030<double>,std::vector<std::array<double,3ul>,std::allocator<std::array<double,3ul>>>,std::vector<double,std::allocator<double>>>
              ((vector<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_> *)
               local_30,(vector<double,_std::allocator<double>_> *)&i);
  }
  else if (points.
           super__Vector_base<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>.
           _M_impl.super__Vector_impl_data._M_end_of_storage == (pointer)0x932) {
    detail::
    copy_grid<IntegratorXX::LebedevLaikovGrids::lebedev_laikov_2354<double>,std::vector<std::array<double,3ul>,std::allocator<std::array<double,3ul>>>,std::vector<double,std::allocator<double>>>
              ((vector<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_> *)
               local_30,(vector<double,_std::allocator<double>_> *)&i);
  }
  else if (points.
           super__Vector_base<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>.
           _M_impl.super__Vector_impl_data._M_end_of_storage == (pointer)0xa8e) {
    detail::
    copy_grid<IntegratorXX::LebedevLaikovGrids::lebedev_laikov_2702<double>,std::vector<std::array<double,3ul>,std::allocator<std::array<double,3ul>>>,std::vector<double,std::allocator<double>>>
              ((vector<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_> *)
               local_30,(vector<double,_std::allocator<double>_> *)&i);
  }
  else if (points.
           super__Vector_base<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>.
           _M_impl.super__Vector_impl_data._M_end_of_storage == (pointer)0xc02) {
    detail::
    copy_grid<IntegratorXX::LebedevLaikovGrids::lebedev_laikov_3074<double>,std::vector<std::array<double,3ul>,std::allocator<std::array<double,3ul>>>,std::vector<double,std::allocator<double>>>
              ((vector<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_> *)
               local_30,(vector<double,_std::allocator<double>_> *)&i);
  }
  else if (points.
           super__Vector_base<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>.
           _M_impl.super__Vector_impl_data._M_end_of_storage == (pointer)0xd8e) {
    detail::
    copy_grid<IntegratorXX::LebedevLaikovGrids::lebedev_laikov_3470<double>,std::vector<std::array<double,3ul>,std::allocator<std::array<double,3ul>>>,std::vector<double,std::allocator<double>>>
              ((vector<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_> *)
               local_30,(vector<double,_std::allocator<double>_> *)&i);
  }
  else if (points.
           super__Vector_base<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>.
           _M_impl.super__Vector_impl_data._M_end_of_storage == (pointer)0xf32) {
    detail::
    copy_grid<IntegratorXX::LebedevLaikovGrids::lebedev_laikov_3890<double>,std::vector<std::array<double,3ul>,std::allocator<std::array<double,3ul>>>,std::vector<double,std::allocator<double>>>
              ((vector<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_> *)
               local_30,(vector<double,_std::allocator<double>_> *)&i);
  }
  else if (points.
           super__Vector_base<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>.
           _M_impl.super__Vector_impl_data._M_end_of_storage == (pointer)0x10ee) {
    detail::
    copy_grid<IntegratorXX::LebedevLaikovGrids::lebedev_laikov_4334<double>,std::vector<std::array<double,3ul>,std::allocator<std::array<double,3ul>>>,std::vector<double,std::allocator<double>>>
              ((vector<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_> *)
               local_30,(vector<double,_std::allocator<double>_> *)&i);
  }
  else if (points.
           super__Vector_base<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>.
           _M_impl.super__Vector_impl_data._M_end_of_storage == (pointer)0x12c2) {
    detail::
    copy_grid<IntegratorXX::LebedevLaikovGrids::lebedev_laikov_4802<double>,std::vector<std::array<double,3ul>,std::allocator<std::array<double,3ul>>>,std::vector<double,std::allocator<double>>>
              ((vector<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_> *)
               local_30,(vector<double,_std::allocator<double>_> *)&i);
  }
  else if (points.
           super__Vector_base<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>.
           _M_impl.super__Vector_impl_data._M_end_of_storage == (pointer)0x16b2) {
    detail::
    copy_grid<IntegratorXX::LebedevLaikovGrids::lebedev_laikov_5810<double>,std::vector<std::array<double,3ul>,std::allocator<std::array<double,3ul>>>,std::vector<double,std::allocator<double>>>
              ((vector<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_> *)
               local_30,(vector<double,_std::allocator<double>_> *)&i);
  }
  for (local_68 = 0;
      (pointer)(long)local_68 <
      points.super__Vector_base<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage; local_68 = local_68 + 1) {
    pvVar1 = std::vector<double,_std::allocator<double>_>::operator[]
                       ((vector<double,_std::allocator<double>_> *)&i,(long)local_68);
    *pvVar1 = *pvVar1 * 12.566370614359172;
  }
  std::
  make_tuple<std::vector<std::array<double,3ul>,std::allocator<std::array<double,3ul>>>&,std::vector<double,std::allocator<double>>&>
            (__return_storage_ptr__,
             (vector<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_> *)local_30,
             (vector<double,_std::allocator<double>_> *)&i);
  std::vector<double,_std::allocator<double>_>::~vector
            ((vector<double,_std::allocator<double>_> *)&i);
  std::vector<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>::~vector
            ((vector<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_> *)local_30)
  ;
  return __return_storage_ptr__;
}

Assistant:

inline static std::tuple<point_container,weight_container>
    generate( size_t npts ) {

    point_container  points( npts );
    weight_container weights( npts );

    using namespace LebedevLaikovGrids;

    if( npts == 6 ) 
      detail::copy_grid<lebedev_laikov_6<RealType>>( points, weights );
    else if( npts == 14 ) 
      detail::copy_grid<lebedev_laikov_14<RealType>>( points, weights );
    else if( npts == 26 ) 
      detail::copy_grid<lebedev_laikov_26<RealType>>( points, weights );
    else if( npts == 38 ) 
      detail::copy_grid<lebedev_laikov_38<RealType>>( points, weights );
    else if( npts == 50 ) 
      detail::copy_grid<lebedev_laikov_50<RealType>>( points, weights );
    else if( npts == 74 ) 
      detail::copy_grid<lebedev_laikov_74<RealType>>( points, weights );
    else if( npts == 86 ) 
      detail::copy_grid<lebedev_laikov_86<RealType>>( points, weights );
    else if( npts == 110 ) 
      detail::copy_grid<lebedev_laikov_110<RealType>>( points, weights );
    else if( npts == 146 ) 
      detail::copy_grid<lebedev_laikov_146<RealType>>( points, weights );
    else if( npts == 170 ) 
      detail::copy_grid<lebedev_laikov_170<RealType>>( points, weights );
    else if( npts == 194 ) 
      detail::copy_grid<lebedev_laikov_194<RealType>>( points, weights );
    else if( npts == 230 ) 
      detail::copy_grid<lebedev_laikov_230<RealType>>( points, weights );
    else if( npts == 266 ) 
      detail::copy_grid<lebedev_laikov_266<RealType>>( points, weights );
    else if( npts == 302 ) 
      detail::copy_grid<lebedev_laikov_302<RealType>>( points, weights );
    else if( npts == 350 ) 
      detail::copy_grid<lebedev_laikov_350<RealType>>( points, weights );
    else if( npts == 434 ) 
      detail::copy_grid<lebedev_laikov_434<RealType>>( points, weights );
    else if( npts == 590 ) 
      detail::copy_grid<lebedev_laikov_590<RealType>>( points, weights );
    else if( npts == 770 ) 
      detail::copy_grid<lebedev_laikov_770<RealType>>( points, weights );
    else if( npts == 974 ) 
      detail::copy_grid<lebedev_laikov_974<RealType>>( points, weights );
    else if( npts == 1202 ) 
      detail::copy_grid<lebedev_laikov_1202<RealType>>( points, weights );
    else if( npts == 1454 ) 
      detail::copy_grid<lebedev_laikov_1454<RealType>>( points, weights );
    else if( npts == 1730 ) 
      detail::copy_grid<lebedev_laikov_1730<RealType>>( points, weights );
    else if( npts == 2030 ) 
      detail::copy_grid<lebedev_laikov_2030<RealType>>( points, weights );
    else if( npts == 2354 ) 
      detail::copy_grid<lebedev_laikov_2354<RealType>>( points, weights );
    else if( npts == 2702 ) 
      detail::copy_grid<lebedev_laikov_2702<RealType>>( points, weights );
    else if( npts == 3074 ) 
      detail::copy_grid<lebedev_laikov_3074<RealType>>( points, weights );
    else if( npts == 3470 ) 
      detail::copy_grid<lebedev_laikov_3470<RealType>>( points, weights );
    else if( npts == 3890 ) 
      detail::copy_grid<lebedev_laikov_3890<RealType>>( points, weights );
    else if( npts == 4334 ) 
      detail::copy_grid<lebedev_laikov_4334<RealType>>( points, weights );
    else if( npts == 4802 ) 
      detail::copy_grid<lebedev_laikov_4802<RealType>>( points, weights );
    else if( npts == 5810 ) 
      detail::copy_grid<lebedev_laikov_5810<RealType>>( points, weights );

    // Pretabulated weights are missing 4 pi
    for(auto i=0; i < npts; i++)
      weights[i] *= 4.0*M_PI;
        
    return std::make_tuple( points, weights );

  }